

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O3

vector<short,_std::allocator<short>_> *
cppqc::shrinkIntegral<short>(vector<short,_std::allocator<short>_> *__return_storage_ptr__,short x)

{
  iterator __position;
  short sVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 uStack_28;
  
  uVar2 = (ulong)(ushort)x;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (x < 0) {
    uStack_28._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_28._0_4_ = (undefined4)in_RAX;
    uStack_28._0_6_ = CONCAT24(-x,(undefined4)uStack_28);
    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
              (__return_storage_ptr__,(iterator)0x0,(short *)((long)&uStack_28 + 4));
  }
  else {
    uStack_28 = in_RAX;
    if (x == 0) {
      return __return_storage_ptr__;
    }
  }
  do {
    sVar1 = (short)uVar2;
    uStack_28._0_4_ = CONCAT22(x - sVar1,(undefined2)uStack_28);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                (__return_storage_ptr__,__position,(short *)((long)&uStack_28 + 2));
    }
    else {
      *__position._M_current = x - sVar1;
      (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar2 = (ulong)((uint)(int)(short)((short)((uVar2 & 0xffff) >> 0xf) + sVar1) >> 1);
  } while (2 < (ushort)(sVar1 + 1U));
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}